

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_leave_cluster_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 auVar6 [16];
  ptr<resp_msg> pVar7;
  
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  puVar4 = (undefined8 *)operator_new(0x40);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_00178730;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar4[3] = peVar3;
  *(undefined4 *)(puVar4 + 4) = 0xf;
  *(undefined4 *)((long)puVar4 + 0x24) = uVar2;
  *(undefined4 *)(puVar4 + 5) = uVar1;
  puVar4[2] = &PTR__msg_base_00178780;
  puVar4[6] = 0;
  *(undefined1 *)(puVar4 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar4;
  this->_vptr_raft_server = (_func_int **)(puVar4 + 2);
  _Var5._M_pi = extraout_RDX;
  if (*(char *)((long)&req->last_log_idx_ + 1) == '\0') {
    *(undefined4 *)((long)&req->last_log_idx_ + 4) = 2;
    auVar6 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    _Var5._M_pi = auVar6._8_8_;
    puVar4[6] = auVar6._0_8_;
    *(undefined1 *)(puVar4 + 7) = 1;
  }
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leave_cluster_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::leave_cluster_response, id_, req.get_src()));
    if (!config_changing_)
    {
        steps_to_down_ = 2;
        resp->accept(log_store_->next_slot());
    }

    return resp;
}